

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O2

string * __thiscall
cmCTestCurl::Escape(string *__return_storage_ptr__,cmCTestCurl *this,string *source)

{
  char *__s;
  allocator<char> local_11;
  
  __s = curl_easy_escape((Curl_easy *)this->Curl,(source->_M_dataplus)._M_p,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_11)
  ;
  curl_free(__s);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestCurl::Escape(std::string const& source)
{
  char* data1 = curl_easy_escape(this->Curl, source.c_str(), 0);
  std::string ret = data1;
  curl_free(data1);
  return ret;
}